

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O2

void slang::lshrFar(uint64_t *dst,uint64_t *src,uint32_t wordShift,uint32_t offset,uint32_t start,
                   uint32_t numWords)

{
  ulong *puVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  iVar5 = numWords + start;
  if (wordShift == 0) {
    for (uVar3 = (ulong)start; uVar3 < iVar5 - offset; uVar3 = uVar3 + 1) {
      dst[uVar3] = src[offset + (int)uVar3];
    }
  }
  else {
    bVar2 = (byte)wordShift;
    uVar4 = (ulong)(start + offset);
    for (uVar3 = (ulong)start; uVar3 < ~offset + iVar5; uVar3 = uVar3 + 1) {
      puVar1 = src + uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
      dst[uVar3] = src[uVar4] << (0x40 - bVar2 & 0x3f) | *puVar1 >> (bVar2 & 0x3f);
    }
    dst[~offset + iVar5] = src[iVar5 - 1] >> (bVar2 & 0x3f);
  }
  return;
}

Assistant:

static void lshrFar(uint64_t* dst, uint64_t* src, uint32_t wordShift, uint32_t offset,
                    uint32_t start, uint32_t numWords) {
    // this function is split out so that if we have an unknown value we can reuse the code
    // optimization: move whole words
    if (wordShift == 0) {
        for (uint32_t i = start; i < start + numWords - offset; i++)
            dst[i] = src[i + offset];
    }
    else {
        // shift low order words
        uint32_t breakWord = start + numWords - offset - 1;
        for (uint32_t i = start; i < breakWord; i++) {
            dst[i] = (src[i + offset] >> wordShift) |
                     (src[i + offset + 1] << (SVInt::BITS_PER_WORD - wordShift));
        }

        // shift the "break" word
        dst[breakWord] = src[breakWord + offset] >> wordShift;
    }
}